

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O3

void __thiscall
Assimp::D3MF::OpcPackageRelationshipReader::OpcPackageRelationshipReader
          (OpcPackageRelationshipReader *this,XmlReader *xmlReader)

{
  int iVar1;
  
  (this->m_relationShips).
  super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_relationShips).
  super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_relationShips).
  super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    iVar1 = (*xmlReader->_vptr_IIrrXMLReader[2])(xmlReader);
    if ((char)iVar1 == '\0') break;
    iVar1 = (*xmlReader->_vptr_IIrrXMLReader[3])(xmlReader);
    if (iVar1 == 1) {
      (*xmlReader->_vptr_IIrrXMLReader[0xd])(xmlReader);
      iVar1 = std::__cxx11::string::compare(XmlTag::RELS_RELATIONSHIP_CONTAINER_abi_cxx11_);
      if (iVar1 == 0) {
        ParseRootNode(this,xmlReader);
      }
    }
  }
  return;
}

Assistant:

OpcPackageRelationshipReader(XmlReader* xmlReader) {        
        while(xmlReader->read()) {
            if(xmlReader->getNodeType() == irr::io::EXN_ELEMENT &&
               xmlReader->getNodeName() == XmlTag::RELS_RELATIONSHIP_CONTAINER)
            {
                ParseRootNode(xmlReader);
            }
        }
    }